

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

Vector3f __thiscall
Renderer::colorPath(Renderer *this,float tmin,Object3D *light,
                   vector<Ray,_std::allocator<Ray>_> *eye_path,
                   vector<Hit,_std::allocator<Hit>_> *eye_hits,
                   vector<Ray,_std::allocator<Ray>_> *light_path,
                   vector<Hit,_std::allocator<Hit>_> *light_hits)

{
  float *pfVar1;
  unsigned_long uVar2;
  size_type sVar3;
  float *pfVar4;
  undefined8 extraout_XMM0_Qa;
  Vector3f VVar6;
  vector<Hit,_std::allocator<Hit>_> *in_stack_00000008;
  undefined1 local_e4 [12];
  float *local_d8;
  unsigned_long j;
  unsigned_long i;
  undefined1 local_c0 [4];
  float overallDensity;
  Vector3f intensity;
  undefined1 local_a8 [8];
  vector<Vector3f,_std::allocator<Vector3f>_> light_bsdf;
  vector<Vector3f,_std::allocator<Vector3f>_> eye_bsdf;
  vector<float,_std::allocator<float>_> light_pdfs;
  vector<float,_std::allocator<float>_> eye_pdfs;
  vector<Ray,_std::allocator<Ray>_> *light_path_local;
  vector<Hit,_std::allocator<Hit>_> *eye_hits_local;
  vector<Ray,_std::allocator<Ray>_> *eye_path_local;
  Object3D *light_local;
  float tmin_local;
  Renderer *this_local;
  float fVar5;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Vector3f,_std::allocator<Vector3f>_>::vector
            ((vector<Vector3f,_std::allocator<Vector3f>_> *)
             &light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Vector3f,_std::allocator<Vector3f>_>::vector
            ((vector<Vector3f,_std::allocator<Vector3f>_> *)local_a8);
  sVar3 = std::vector<Ray,_std::allocator<Ray>_>::size
                    ((vector<Ray,_std::allocator<Ray>_> *)eye_hits);
  if (2 < sVar3) {
    precomputeCumulativeBSDF
              ((Renderer *)light,(vector<Ray,_std::allocator<Ray>_> *)eye_hits,
               (vector<Hit,_std::allocator<Hit>_> *)light_path,
               (vector<Vector3f,_std::allocator<Vector3f>_> *)
               &light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<float,_std::allocator<float>_> *)
               &light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  sVar3 = std::vector<Ray,_std::allocator<Ray>_>::size
                    ((vector<Ray,_std::allocator<Ray>_> *)light_hits);
  if (2 < sVar3) {
    precomputeCumulativeBSDF
              ((Renderer *)light,(vector<Ray,_std::allocator<Ray>_> *)light_hits,in_stack_00000008,
               (vector<Vector3f,_std::allocator<Vector3f>_> *)local_a8,
               (vector<float,_std::allocator<float>_> *)
               &eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  Vector3f::Vector3f((Vector3f *)local_c0,0.0);
  i._4_4_ = 0.0;
  j = 2;
  while( true ) {
    uVar2 = j;
    sVar3 = std::vector<Ray,_std::allocator<Ray>_>::size
                      ((vector<Ray,_std::allocator<Ray>_> *)eye_hits);
    if (sVar3 < uVar2) break;
    local_d8 = (float *)0x1;
    while( true ) {
      pfVar1 = local_d8;
      pfVar4 = (float *)std::vector<Ray,_std::allocator<Ray>_>::size
                                  ((vector<Ray,_std::allocator<Ray>_> *)light_hits);
      if (pfVar4 < pfVar1) break;
      colorPathCombination
                ((Renderer *)local_e4,tmin,light,eye_path,eye_hits,
                 (vector<Vector3f,_std::allocator<Vector3f>_> *)light_path,
                 (vector<float,_std::allocator<float>_> *)
                 &light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<Ray,_std::allocator<Ray>_> *)
                 &light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,light_hits,
                 (vector<Vector3f,_std::allocator<Vector3f>_> *)in_stack_00000008,
                 (vector<float,_std::allocator<float>_> *)local_a8,
                 (unsigned_long)
                 &eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,j,local_d8);
      Vector3f::operator+=((Vector3f *)local_c0,(Vector3f *)local_e4);
      local_d8 = (float *)((long)local_d8 + 1);
    }
    j = j + 1;
  }
  VVar6 = operator/((Vector3f *)this,i._4_4_);
  fVar5 = VVar6.m_elements[2];
  std::vector<Vector3f,_std::allocator<Vector3f>_>::~vector
            ((vector<Vector3f,_std::allocator<Vector3f>_> *)local_a8);
  std::vector<Vector3f,_std::allocator<Vector3f>_>::~vector
            ((vector<Vector3f,_std::allocator<Vector3f>_> *)
             &light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  VVar6.m_elements[2] = fVar5;
  VVar6.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  VVar6.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vector3f)VVar6.m_elements;
}

Assistant:

Vector3f Renderer::colorPath(float tmin, Object3D *light, const std::vector<Ray> &eye_path, std::vector<Hit> &eye_hits,
                             const std::vector<Ray> &light_path, std::vector<Hit> &light_hits) {

    // First, pre-compute the BSDF and weights for each component of the paths.
    std::vector<float> eye_pdfs, light_pdfs;
    std::vector<Vector3f> eye_bsdf, light_bsdf;
    if (eye_path.size() > 2) {
        precomputeCumulativeBSDF(eye_path, eye_hits, eye_bsdf, eye_pdfs);
    }
    if (light_path.size() > 2) {
        precomputeCumulativeBSDF(light_path, light_hits, light_bsdf, light_pdfs);
    }

    // For each combination, find the intensity; average once all are found.
    Vector3f intensity;
    float overallDensity = 0;
    for (unsigned long i = 2; i <= eye_path.size(); i++) {
        for (unsigned long j = 1; j <= light_path.size(); j++) {
            intensity += colorPathCombination(tmin, light, eye_path, eye_hits, eye_bsdf, eye_pdfs, light_path,
                                              light_hits, light_bsdf, light_pdfs, i, j, overallDensity);
        }
    }
    return intensity / overallDensity;
}